

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tstring.c
# Opt level: O0

char * reverse(char *s)

{
  char cVar1;
  size_t sVar2;
  uint local_24;
  uint local_20;
  uint j;
  uint i;
  char chr;
  unsigned_long len;
  char *s_local;
  
  sVar2 = strlen(s);
  local_20 = (uint)sVar2;
  for (local_24 = 0; local_20 = local_20 - 1, local_24 < local_20; local_24 = local_24 + 1) {
    cVar1 = s[local_24];
    s[local_24] = s[local_20];
    s[local_20] = cVar1;
  }
  return s;
}

Assistant:

char *reverse(char *s) {
    unsigned long len = strlen(s);
    char chr;
    for (uint i = len - 1, j = 0; j < i; --i, j++) {
        chr = s[j];
        s[j] = s[i];
        s[i] = chr;
    }
    return s;
}